

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void in2_r1_32u(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  TCGv_i64 pTVar2;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
  o->in2 = pTVar2;
  pTVar2 = o->in2;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  tcg_gen_ext32u_i64_s390x(tcg_ctx_00,pTVar2,tcg_ctx_00->regs[iVar1]);
  return;
}

Assistant:

static void in2_r1_32u(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext32u_i64(tcg_ctx, o->in2, tcg_ctx->regs[get_field(s, r1)]);
}